

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

int Str_CountBits(word i)

{
  ulong uVar1;
  word i_local;
  
  if (i == 0) {
    i_local._4_4_ = 0;
  }
  else {
    uVar1 = i & i - 1;
    if (uVar1 == 0) {
      i_local._4_4_ = 1;
    }
    else {
      uVar1 = uVar1 & uVar1 - 1;
      if (uVar1 == 0) {
        i_local._4_4_ = 2;
      }
      else {
        uVar1 = uVar1 - (uVar1 >> 1 & 0x5555555555555555);
        uVar1 = (uVar1 & 0x3333333333333333) + (uVar1 >> 2 & 0x3333333333333333);
        i_local._4_4_ =
             (uint)(byte)((uVar1 + (uVar1 >> 4) & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
      }
    }
  }
  return i_local._4_4_;
}

Assistant:

static inline int Str_CountBits( word i )
{
    if ( i == 0 )
        return 0;
    i = (i & (i - 1));
    if ( i == 0 )
        return 1;
    i = (i & (i - 1));
    if ( i == 0 )
        return 2;
    i = i - ((i >> 1) & 0x5555555555555555);
    i = (i & 0x3333333333333333) + ((i >> 2) & 0x3333333333333333);
    i = ((i + (i >> 4)) & 0x0F0F0F0F0F0F0F0F);
    return (i*(0x0101010101010101))>>56;
}